

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svo_bitset.hh
# Opt level: O0

SVOBitset * __thiscall gss::innards::SVOBitset::operator=(SVOBitset *this,SVOBitset *other)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  BitWord *pBVar4;
  SVOBitset *in_RSI;
  SVOBitset *in_RDI;
  BitWord *in_stack_ffffffffffffffd0;
  BitWord *in_stack_ffffffffffffffd8;
  SVOBitset *local_8;
  
  local_8 = in_RDI;
  if (in_RSI != in_RDI) {
    bVar2 = _is_long(in_RSI);
    if (bVar2) {
      bVar2 = _is_long(in_RDI);
      if (bVar2) {
        if (in_RDI->n_words != in_RSI->n_words) {
          in_stack_ffffffffffffffd8 = (in_RDI->_data).long_data;
          if (in_stack_ffffffffffffffd8 != (BitWord *)0x0) {
            operator_delete__(in_stack_ffffffffffffffd8);
          }
          auVar1 = ZEXT416(in_RDI->n_words) * ZEXT816(8);
          uVar3 = auVar1._0_8_;
          if (auVar1._8_8_ != 0) {
            uVar3 = 0xffffffffffffffff;
          }
          pBVar4 = (BitWord *)operator_new__(uVar3);
          (in_RDI->_data).long_data = pBVar4;
        }
      }
      else {
        in_RDI->n_words = in_RSI->n_words;
        auVar1 = ZEXT416(in_RDI->n_words) * ZEXT816(8);
        uVar3 = auVar1._0_8_;
        if (auVar1._8_8_ != 0) {
          uVar3 = 0xffffffffffffffff;
        }
        pBVar4 = (BitWord *)operator_new__(uVar3);
        (in_RDI->_data).long_data = pBVar4;
      }
      std::copy<unsigned_long_long*,unsigned_long_long*>
                ((unsigned_long_long *)in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      local_8 = in_RDI;
    }
    else {
      bVar2 = _is_long(in_RDI);
      if ((bVar2) &&
         (in_stack_ffffffffffffffd0 = (in_RDI->_data).long_data,
         in_stack_ffffffffffffffd0 != (BitWord *)0x0)) {
        operator_delete__(in_stack_ffffffffffffffd0);
      }
      in_RDI->n_words = in_RSI->n_words;
      std::copy<unsigned_long_long_const*,unsigned_long_long*>
                ((unsigned_long_long *)in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

auto operator=(const SVOBitset & other) -> SVOBitset &
        {
            if (&other == this)
                return *this;

            if (other._is_long()) {
                if (! _is_long()) {
                    n_words = other.n_words;
                    _data.long_data = new BitWord[n_words];
                }
                else if (n_words != other.n_words) {
                    delete[] _data.long_data;
                    _data.long_data = new BitWord[n_words];
                }

                std::copy(other._data.long_data, other._data.long_data + other.n_words, _data.long_data);
            }
            else {
                if (_is_long())
                    delete[] _data.long_data;
                n_words = other.n_words;
                std::copy(&other._data.short_data[0], &other._data.short_data[svo_size], &_data.short_data[0]);
            }

            return *this;
        }